

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *color,
           LodePNGEncoderSettings *settings)

{
  byte bVar1;
  uchar filterType;
  uint bpp_00;
  size_t sVar2;
  size_t length;
  ulong bytewidth_00;
  uchar *puVar3;
  size_t sVar4;
  uint local_5d8;
  undefined1 local_5d0 [4];
  uint testsize;
  LodePNGCompressSettings zlibsettings;
  uchar *dummy;
  uint bestType_2;
  uint type_4;
  size_t smallest_1;
  uchar *attempt_2 [5];
  size_t size [5];
  uchar type_3;
  size_t inindex_1;
  size_t outindex_1;
  size_t sum_1;
  uint count [256];
  uint bestType_1;
  uint type_2;
  size_t bestSum;
  uchar *attempt_1 [5];
  ulong uStack_c0;
  uchar s;
  size_t sum;
  uchar bestType;
  ulong uStack_b0;
  uchar type_1;
  size_t smallest;
  uchar *attempt [5];
  size_t inindex;
  size_t outindex;
  LodePNGFilterStrategy local_68;
  uint uStack_64;
  uchar type;
  LodePNGFilterStrategy strategy;
  uint error;
  uint y;
  uint x;
  uchar *prevline;
  size_t bytewidth;
  size_t linebytes;
  uint bpp;
  LodePNGEncoderSettings *settings_local;
  LodePNGColorMode *color_local;
  uint h_local;
  uint w_local;
  uchar *in_local;
  uchar *out_local;
  
  bpp_00 = lodepng_get_bpp(color);
  sVar2 = lodepng_get_raw_size_idat(w,1,bpp_00);
  length = sVar2 - 1;
  bytewidth_00 = (ulong)(bpp_00 + 7 >> 3);
  _y = (uchar *)0x0;
  uStack_64 = 0;
  local_68 = settings->filter_strategy;
  if ((settings->filter_palette_zero != 0) &&
     ((color->colortype == LCT_PALETTE || (color->bitdepth < 8)))) {
    local_68 = LFS_ZERO;
  }
  if (bpp_00 == 0) {
    out_local._4_4_ = 0x1f;
  }
  else {
    if (((int)local_68 < 0) || (4 < (int)local_68)) {
      if (local_68 == LFS_MINSUM) {
        uStack_b0 = 0;
        sum._6_1_ = 0;
        for (sum._7_1_ = 0; sum._7_1_ != 5; sum._7_1_ = sum._7_1_ + 1) {
          puVar3 = (uchar *)lodepng_malloc(length);
          attempt[(ulong)sum._7_1_ - 1] = puVar3;
          if (attempt[(ulong)sum._7_1_ - 1] == (uchar *)0x0) {
            uStack_64 = 0x53;
          }
        }
        if (uStack_64 == 0) {
          for (strategy = LFS_ZERO; strategy != h; strategy = strategy + LFS_ONE) {
            for (sum._7_1_ = 0; sum._7_1_ != 5; sum._7_1_ = sum._7_1_ + 1) {
              uStack_c0 = 0;
              filterScanline(attempt[(ulong)sum._7_1_ - 1],in + strategy * length,_y,length,
                             bytewidth_00,sum._7_1_);
              if (sum._7_1_ == 0) {
                for (error = 0; error != length; error = error + 1) {
                  uStack_c0 = *(byte *)(smallest + error) + uStack_c0;
                }
              }
              else {
                for (error = 0; error != length; error = error + 1) {
                  bVar1 = attempt[(ulong)sum._7_1_ - 1][error];
                  if (bVar1 < 0x80) {
                    local_5d8 = (uint)bVar1;
                  }
                  else {
                    local_5d8 = 0xff - bVar1;
                  }
                  uStack_c0 = local_5d8 + uStack_c0;
                }
              }
              if ((sum._7_1_ == 0) || (uStack_c0 < uStack_b0)) {
                sum._6_1_ = sum._7_1_;
                uStack_b0 = uStack_c0;
              }
            }
            _y = in + strategy * length;
            out[strategy * sVar2] = sum._6_1_;
            for (error = 0; error != length; error = error + 1) {
              out[strategy * sVar2 + 1 + (ulong)error] = attempt[(ulong)sum._6_1_ - 1][error];
            }
          }
        }
        for (sum._7_1_ = 0; sum._7_1_ != 5; sum._7_1_ = sum._7_1_ + 1) {
          lodepng_free(attempt[(ulong)sum._7_1_ - 1]);
        }
      }
      else if (local_68 == LFS_ENTROPY) {
        _bestType_1 = 0;
        count[0xfe] = 0;
        for (count[0xff] = 0; count[0xff] != 5; count[0xff] = count[0xff] + 1) {
          puVar3 = (uchar *)lodepng_malloc(length);
          attempt_1[(ulong)count[0xff] - 1] = puVar3;
          if (attempt_1[(ulong)count[0xff] - 1] == (uchar *)0x0) {
            uStack_64 = 0x53;
          }
        }
        if (uStack_64 == 0) {
          for (strategy = LFS_ZERO; strategy != h; strategy = strategy + LFS_ONE) {
            for (count[0xff] = 0; count[0xff] != 5; count[0xff] = count[0xff] + 1) {
              outindex_1 = 0;
              filterScanline(attempt_1[(ulong)count[0xff] - 1],in + strategy * length,_y,length,
                             bytewidth_00,(uchar)count[0xff]);
              lodepng_memset(&sum_1,0,0x400);
              for (error = 0; error != length; error = error + 1) {
                count[(ulong)attempt_1[(ulong)count[0xff] - 1][error] - 2] =
                     count[(ulong)attempt_1[(ulong)count[0xff] - 1][error] - 2] + 1;
              }
              count[(ulong)count[0xff] - 2] = count[(ulong)count[0xff] - 2] + 1;
              for (error = 0; error != 0x100; error = error + 1) {
                sVar4 = ilog2i((ulong)count[(ulong)error - 2]);
                outindex_1 = sVar4 + outindex_1;
              }
              if ((count[0xff] == 0) || (_bestType_1 < outindex_1)) {
                count[0xfe] = count[0xff];
                _bestType_1 = outindex_1;
              }
            }
            _y = in + strategy * length;
            out[strategy * sVar2] = (uchar)count[0xfe];
            for (error = 0; error != length; error = error + 1) {
              out[strategy * sVar2 + 1 + (ulong)error] = attempt_1[(ulong)count[0xfe] - 1][error];
            }
          }
        }
        for (count[0xff] = 0; count[0xff] != 5; count[0xff] = count[0xff] + 1) {
          lodepng_free(attempt_1[(ulong)count[0xff] - 1]);
        }
      }
      else if (local_68 == LFS_PREDEFINED) {
        for (strategy = LFS_ZERO; strategy != h; strategy = strategy + LFS_ONE) {
          filterType = settings->predefined_filters[strategy];
          out[sVar2 * strategy] = filterType;
          filterScanline(out + sVar2 * strategy + 1,in + length * strategy,_y,length,bytewidth_00,
                         filterType);
          _y = in + length * strategy;
        }
      }
      else {
        if (local_68 != LFS_BRUTE_FORCE) {
          return 0x58;
        }
        _bestType_2 = 0;
        dummy._0_4_ = 0;
        lodepng_memcpy(local_5d0,settings,0x30);
        local_5d0 = (undefined1  [4])0x1;
        zlibsettings.nicematch = 0;
        zlibsettings.lazymatching = 0;
        zlibsettings.custom_zlib =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        for (dummy._4_4_ = 0; dummy._4_4_ != 5; dummy._4_4_ = dummy._4_4_ + 1) {
          puVar3 = (uchar *)lodepng_malloc(length);
          attempt_2[(ulong)dummy._4_4_ - 1] = puVar3;
          if (attempt_2[(ulong)dummy._4_4_ - 1] == (uchar *)0x0) {
            uStack_64 = 0x53;
          }
        }
        if (uStack_64 == 0) {
          for (strategy = LFS_ZERO; strategy != h; strategy = strategy + LFS_ONE) {
            for (dummy._4_4_ = 0; dummy._4_4_ != 5; dummy._4_4_ = dummy._4_4_ + 1) {
              filterScanline(attempt_2[(ulong)dummy._4_4_ - 1],in + strategy * length,_y,length,
                             bytewidth_00,(uchar)dummy._4_4_);
              size[(ulong)dummy._4_4_ - 1] = 0;
              zlibsettings.custom_context = (void *)0x0;
              zlib_compress((uchar **)&zlibsettings.custom_context,size + ((ulong)dummy._4_4_ - 1),
                            attempt_2[(ulong)dummy._4_4_ - 1],length & 0xffffffff,
                            (LodePNGCompressSettings *)local_5d0);
              lodepng_free(zlibsettings.custom_context);
              if ((dummy._4_4_ == 0) || (size[(ulong)dummy._4_4_ - 1] < _bestType_2)) {
                dummy._0_4_ = dummy._4_4_;
                _bestType_2 = size[(ulong)dummy._4_4_ - 1];
              }
            }
            _y = in + strategy * length;
            out[strategy * sVar2] = (uchar)(uint)dummy;
            for (error = 0; error != length; error = error + 1) {
              out[strategy * sVar2 + 1 + (ulong)error] = attempt_2[(ulong)(uint)dummy - 1][error];
            }
          }
        }
        for (dummy._4_4_ = 0; dummy._4_4_ != 5; dummy._4_4_ = dummy._4_4_ + 1) {
          lodepng_free(attempt_2[(ulong)dummy._4_4_ - 1]);
        }
      }
    }
    else {
      for (strategy = LFS_ZERO; strategy != h; strategy = strategy + LFS_ONE) {
        attempt[4] = (uchar *)(length * strategy);
        out[sVar2 * strategy] = (uchar)local_68;
        filterScanline(out + sVar2 * strategy + 1,in + (long)attempt[4],_y,length,bytewidth_00,
                       (uchar)local_68);
        _y = in + (long)attempt[4];
      }
    }
    out_local._4_4_ = uStack_64;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* color, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(color);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (color->colortype == LCT_PALETTE || color->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering*/
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum < smallest) {
            bestType = type;
            smallest = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          lodepng_memset(count, 0, 256 * sizeof(*count));
          for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
          ++count[type]; /*the filter type itself is part of the scanline*/
          for(x = 0; x != 256; ++x) {
            sum += ilog2i(count[x]);
          }
          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum > bestSum) {
            bestType = type;
            bestSum = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings;
    lodepng_memcpy(&zlibsettings, &settings->zlibsettings, sizeof(LodePNGCompressSettings));
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }
    if(!error) {
      for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
        for(type = 0; type != 5; ++type) {
          unsigned testsize = (unsigned)linebytes;
          /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          size[type] = 0;
          dummy = 0;
          zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
          lodepng_free(dummy);
          /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || size[type] < smallest) {
            bestType = type;
            smallest = size[type];
          }
        }
        prevline = &in[y * linebytes];
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}